

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall edition_unittest::BoolParseTester::ByteSizeLong(BoolParseTester *this)

{
  uint uVar1;
  int iVar2;
  int32_t value;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint32_t *puVar11;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  BoolParseTester *this_;
  BoolParseTester *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_repeated_bool_lowfield_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar4 == 0) {
    local_c8 = 0;
  }
  else {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar4);
    local_c8 = sVar5 + 1;
  }
  iVar2 = _internal_packed_bool_lowfield_size(this);
  sVar5 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar5 == 0) {
    local_d0 = 0;
  }
  else {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar5);
    local_d0 = sVar6 + 1;
  }
  iVar2 = _internal_repeated_bool_midfield_size(this);
  sVar6 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar6 == 0) {
    local_d8 = 0;
  }
  else {
    sVar7 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar6);
    local_d8 = sVar7 + 2;
  }
  iVar2 = _internal_packed_bool_midfield_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar7 == 0) {
    local_e0 = 0;
  }
  else {
    sVar8 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar7);
    local_e0 = sVar8 + 2;
  }
  iVar2 = _internal_repeated_bool_hifield_size(this);
  sVar8 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar8 == 0) {
    local_e8 = 0;
  }
  else {
    sVar9 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar8);
    local_e8 = sVar9 + 4;
  }
  iVar2 = _internal_packed_bool_hifield_size(this);
  sVar9 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar9 == 0) {
    local_f0 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar9);
    local_f0 = sVar10 + 4;
  }
  puVar11 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar11;
  sStack_58 = (long)(int)((uint)((uVar1 & 1) != 0) << 1) +
              (long)(int)((uint)((uVar1 & 2) != 0) * 3) +
              (long)(int)((uint)((uVar1 & 8) != 0) * 5) +
              local_f0 + sVar9 +
              local_e8 + sVar8 +
              local_e0 + sVar7 + local_d8 + sVar6 + local_d0 + sVar5 + local_c8 + sVar4 + sVar3;
  if ((uVar1 & 4) != 0) {
    value = _internal_other_field(this);
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(value);
    sStack_58 = sVar3 + 2 + sStack_58;
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t BoolParseTester::ByteSizeLong() const {
  const BoolParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.BoolParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated bool repeated_bool_lowfield = 2;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_lowfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 1 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool_lowfield = 3 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_lowfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 1 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool_midfield = 1002;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_midfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool_midfield = 1003 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_midfield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool_hifield = 1000002;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_hifield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 4 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool_hifield = 1000003 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_hifield_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 4 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000008u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00000002u & cached_has_bits) * 3;
  total_size += static_cast<bool>(0x00000001u & cached_has_bits) * 2;
   {
    // int32 other_field = 99;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_other_field());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}